

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IReporter * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  XmlReporter *this_00;
  ReporterConfig *config_local;
  ReporterFactory *this_local;
  
  this_00 = (XmlReporter *)operator_new(0x150);
  XmlReporter::XmlReporter(this_00,config);
  return (IReporter *)this_00;
}

Assistant:

virtual IReporter* create( const ReporterConfig& config ) const {
                return new T( config );
            }